

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O0

void * raviX_malloc(size_t size)

{
  void *pvVar1;
  void *ptr;
  size_t size_local;
  
  pvVar1 = malloc(size);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"out of memory\n");
    exit(1);
  }
  return pvVar1;
}

Assistant:

void *raviX_malloc(size_t size)
{
	void *ptr;
	ptr = malloc(size);
        if (!ptr) {
                fprintf(stderr, "out of memory\n");
                exit(1);
        }
	return ptr;
}